

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O2

void embree::avx::BVHNColliderUserGeom<4>::collide
               (BVH *bvh0,BVH *bvh1,RTCCollideFunc callback,void *userPtr)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_68;
  undefined1 local_58 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  undefined1 local_38 [16];
  BVHNCollider<4> local_28;
  
  local_28.scene0 = bvh0->scene;
  local_28.scene1 = bvh1->scene;
  local_28._vptr_BVHNCollider = (_func_int **)&PTR_processLeaf_021e4d10;
  local_48.m128 =
       (__m128)vminps_avx((bvh0->super_AccelData).bounds.bounds0.lower.field_0,
                          (bvh0->super_AccelData).bounds.bounds1.lower.field_0);
  local_38 = vmaxps_avx((undefined1  [16])(bvh0->super_AccelData).bounds.bounds0.upper.field_0,
                        (undefined1  [16])(bvh0->super_AccelData).bounds.bounds1.upper.field_0);
  local_68.m128 =
       (__m128)vminps_avx((bvh1->super_AccelData).bounds.bounds0.lower.field_0,
                          (bvh1->super_AccelData).bounds.bounds1.lower.field_0);
  local_58 = vmaxps_avx((undefined1  [16])(bvh1->super_AccelData).bounds.bounds0.upper.field_0,
                        (undefined1  [16])(bvh1->super_AccelData).bounds.bounds1.upper.field_0);
  local_28.callback = callback;
  local_28.userPtr = userPtr;
  BVHNCollider<4>::collide_recurse_entry
            (&local_28,(NodeRef)(bvh0->root).ptr,(BBox3fa *)&local_48.field_1,
             (NodeRef)(bvh1->root).ptr,(BBox3fa *)&local_68.field_1);
  return;
}

Assistant:

void BVHNColliderUserGeom<N>::collide(BVH* __restrict__ bvh0, BVH* __restrict__ bvh1, RTCCollideFunc callback, void* userPtr)
    { 
      BVHNColliderUserGeom<N>(bvh0->scene,bvh1->scene,callback,userPtr).
        collide_recurse_entry(bvh0->root,bvh0->bounds.bounds(),bvh1->root,bvh1->bounds.bounds());
    }